

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O3

void JitFFI::SysV64::create_return(JitFuncCallerCreater *jfcc,RetData *retdata)

{
  byte bVar1;
  ushort uVar2;
  uint size;
  uint size_00;
  uint rec [2];
  uint local_18 [2];
  
  bVar1 = retdata->type;
  if (bVar1 == 10) {
    return;
  }
  local_18[0] = 0;
  local_18[1] = 0;
  uVar2 = retdata->size;
  size_00 = (uint)uVar2;
  if (bVar1 == 2) {
    if (uVar2 == 0) {
      return;
    }
    size = 8;
    if (uVar2 < 8) {
      size = size_00;
    }
    create_return_base(jfcc,(byte)(retdata->std).super_StructBaseData & (AT_ComplexX87|AT_X87UP),
                       size,local_18);
    if (retdata->size < 9) {
      return;
    }
    JitFuncCreater::push((jfcc->super_JitFuncCallerCreaterX64).data,'H',0x83,0xc3,'\b');
    bVar1 = (byte)(retdata->std).super_StructBaseData >> 4;
    size_00 = retdata->size - 8;
  }
  create_return_base(jfcc,(uint)bVar1,size_00,local_18);
  return;
}

Assistant:

static void create_return(JitFuncCallerCreater &jfcc, const ArgTypeInfo::RetData &retdata) {
			if (retdata.type != AT_Memory) {
				unsigned int rec[2] = { 0 }; // rax/rdx, xmm0/xmm1
				if (retdata.type == AT_Struct) {
					auto &st = retdata.getstd();
					if (retdata.size > 0) {
						create_return_base(jfcc, st.get(0), std::min<unsigned>(retdata.size, 8), rec);
					}
					if (retdata.size > 8) {
						add_rx_byte(jfcc.data, rbx, 8);
						create_return_base(jfcc, st.get(1), retdata.size - 8, rec);
					}
				}
				else {
					create_return_base(jfcc, static_cast<ArgType>(retdata.type), retdata.size, rec);
				}
			}
		}